

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtp-rb.c
# Opt level: O2

void rtp_rb_print_rb(void)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = rtp_rb_end;
  for (uVar2 = rtp_rb_start; uVar2 != uVar1; uVar2 = (uVar2 + 1) % rtp_rb_size) {
    if (rtp_rb[uVar2].length != 0) {
      fprintf(_stderr,"%.3u: seq %.3u\n",(ulong)uVar2,(ulong)*(ushort *)&rtp_rb[uVar2].b.field_0x2);
      uVar1 = rtp_rb_end;
    }
  }
  return;
}

Assistant:

void rtp_rb_print_rb(void) {
  unsigned int i;
  for (i = rtp_rb_start; i != rtp_rb_end; i = (i + 1) % rtp_rb_size) {
    if (rtp_rb[i].length != 0)
      fprintf(stderr, "%.3u: seq %.3u\n", i, rtp_rb[i].b.seq);
  }
}